

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckSightOrRange
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  AActor *pAVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  AActor **obj;
  int iVar7;
  double range;
  AActor *local_48;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e5196;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e5186:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e5196:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe06,
                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_48 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (local_48 == (AActor *)0x0) goto LAB_003e4fe0;
    bVar2 = DObject::IsKindOf((DObject *)local_48,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e5196;
    }
  }
  else {
    if (local_48 != (AActor *)0x0) goto LAB_003e5186;
LAB_003e4fe0:
    local_48 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      pVVar1 = param + 1;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003e5045;
        pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003e5045:
          iVar5 = param[2].field_0.i;
          obj = (AActor **)&DAT_017dc0f8;
          range = (pVVar1->field_0).f * (pVVar1->field_0).f;
          lVar4 = 0;
          iVar7 = 1;
          do {
            if (lVar4 == 8) {
              if (numret < 1) {
LAB_003e5171:
                iVar7 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0xe1c,
                                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                iVar5 = 1;
LAB_003e513a:
                VMReturn::SetInt(ret,iVar5);
              }
              return iVar7;
            }
            if (playeringame[lVar4] == true) {
              bVar2 = DoCheckSightOrRange(local_48,obj[-0x2f],range,iVar5 != 0,true);
              if (bVar2) {
                if (numret < 1) goto LAB_003e5171;
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0xe12,
                                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
LAB_003e5138:
                iVar5 = 0;
                goto LAB_003e513a;
              }
              pAVar3 = GC::ReadBarrier<AActor>(obj);
              if (pAVar3 != (AActor *)0x0) {
                pAVar3 = GC::ReadBarrier<AActor>(obj);
                if (pAVar3->player == (player_t *)0x0) {
                  pAVar3 = GC::ReadBarrier<AActor>(obj);
                  bVar2 = DoCheckSightOrRange(local_48,pAVar3,range,iVar5 != 0,true);
                  if (bVar2) {
                    if (0 < numret) {
                      if (ret == (VMReturn *)0x0) {
                        __assert_fail("ret != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                      ,0xe18,
                                      "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                     );
                      }
                      goto LAB_003e5138;
                    }
                    goto LAB_003e5171;
                  }
                }
              }
            }
            lVar4 = lVar4 + 1;
            obj = obj + 0x54;
          } while( true );
        }
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe08,
                    "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe07,
                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSightOrRange)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(range);
	PARAM_BOOL_DEF(twodi);

	range *= range;
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			// Always check from each player.
			if (DoCheckSightOrRange(self, players[i].mo, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
			// If a player is viewing from a non-player, check that too.
			if (players[i].camera != NULL && players[i].camera->player == NULL &&
				DoCheckSightOrRange(self, players[i].camera, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
		}
	}
	ACTION_RETURN_BOOL(true);
}